

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall rtosc::RtData::reply(RtData *this,char *path,char *args,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char buffer [8192];
  va_list va;
  undefined1 local_20e8 [24];
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  char local_2038 [8192];
  __va_list_tag local_38;
  char *local_18;
  char *local_10;
  long *local_8;
  
  if (in_AL != '\0') {
    local_20b8 = in_XMM0_Qa;
    local_20a8 = in_XMM1_Qa;
    local_2098 = in_XMM2_Qa;
    local_2088 = in_XMM3_Qa;
    local_2078 = in_XMM4_Qa;
    local_2068 = in_XMM5_Qa;
    local_2058 = in_XMM6_Qa;
    local_2048 = in_XMM7_Qa;
  }
  local_38.reg_save_area = local_20e8;
  local_38.overflow_arg_area = &stack0x00000008;
  local_38.fp_offset = 0x30;
  local_38.gp_offset = 0x18;
  local_20d0 = in_RCX;
  local_20c8 = in_R8;
  local_20c0 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  rtosc_vmessage(local_2038,0x2000,in_RSI,in_RDX,&local_38);
  (**(code **)(*in_RDI + 0x20))(in_RDI,local_2038);
  return;
}

Assistant:

void RtData::reply(const char *path, const char *args, ...)
{
    va_list va;
    va_start(va,args);
    char buffer[8192];
    rtosc_vmessage(buffer,8192,path,args,va);
    reply(buffer);
    va_end(va);
}